

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.h
# Opt level: O2

void __thiscall
Eigen::SparseMatrix<double,_0,_int>::swap
          (SparseMatrix<double,_0,_int> *this,SparseMatrix<double,_0,_int> *other)

{
  Index IVar1;
  Index *pIVar2;
  
  pIVar2 = this->m_outerIndex;
  this->m_outerIndex = other->m_outerIndex;
  other->m_outerIndex = pIVar2;
  IVar1 = this->m_innerSize;
  this->m_innerSize = other->m_innerSize;
  other->m_innerSize = IVar1;
  IVar1 = this->m_outerSize;
  this->m_outerSize = other->m_outerSize;
  other->m_outerSize = IVar1;
  pIVar2 = this->m_innerNonZeros;
  this->m_innerNonZeros = other->m_innerNonZeros;
  other->m_innerNonZeros = pIVar2;
  internal::CompressedStorage<double,_int>::swap(&this->m_data,&other->m_data);
  return;
}

Assistant:

inline void swap(SparseMatrix& other)
    {
      //EIGEN_DBG_SPARSE(std::cout << "SparseMatrix:: swap\n");
      std::swap(m_outerIndex, other.m_outerIndex);
      std::swap(m_innerSize, other.m_innerSize);
      std::swap(m_outerSize, other.m_outerSize);
      std::swap(m_innerNonZeros, other.m_innerNonZeros);
      m_data.swap(other.m_data);
    }